

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

void share_listen_closing(Plug *plug,PlugCloseType type,char *error_msg)

{
  ssh_sharing_state *sharestate;
  char *error_msg_local;
  PlugCloseType type_local;
  Plug *plug_local;
  
  if (type != PLUGCLOSE_NORMAL) {
    log_general((ssh_sharing_state *)(plug + -6),"listening socket: %s",error_msg);
  }
  sk_close((Socket *)plug[-5].vt);
  plug[-5].vt = (PlugVtable *)0x0;
  return;
}

Assistant:

static void share_listen_closing(Plug *plug, PlugCloseType type,
                                 const char *error_msg)
{
    ssh_sharing_state *sharestate =
        container_of(plug, ssh_sharing_state, plug);
    if (type != PLUGCLOSE_NORMAL)
        log_general(sharestate, "listening socket: %s", error_msg);
    sk_close(sharestate->listensock);
    sharestate->listensock = NULL;
}